

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNonDsd.c
# Opt level: O3

void Dau_DecSortSet(uint set,int nVars,int *pnUnique,int *pnShared,int *pnFree)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  if (nVars < 1) {
    iVar4 = 0;
    iVar3 = 0;
    iVar2 = 0;
  }
  else {
    bVar1 = 0;
    iVar2 = 0;
    iVar3 = 0;
    iVar4 = 0;
    do {
      switch(set >> (bVar1 & 0x1f) & 3) {
      case 0:
        iVar2 = iVar2 + 1;
        break;
      case 1:
        iVar4 = iVar4 + 1;
        break;
      case 2:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNonDsd.c"
                      ,0x180,"void Dau_DecSortSet(unsigned int, int, int *, int *, int *)");
      case 3:
        iVar3 = iVar3 + 1;
      }
      bVar1 = bVar1 + 2;
      nVars = nVars + -1;
    } while (nVars != 0);
  }
  *pnUnique = iVar4;
  *pnShared = iVar3;
  *pnFree = iVar2;
  return;
}

Assistant:

void Dau_DecSortSet( unsigned set, int nVars, int * pnUnique, int * pnShared, int * pnFree )
{
    int v;
    int nUnique = 0, nShared = 0, nFree = 0;
    for ( v = 0; v < nVars; v++ )
    {
        int Value = ((set >> (v << 1)) & 3);
        if ( Value == 1 )
            nUnique++;
        else if ( Value == 3 )
            nShared++;
        else if ( Value == 0 )
            nFree++;
        else assert( 0 );
    }
    *pnUnique = nUnique;
    *pnShared = nShared;
    *pnFree   = nFree;
}